

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

PgHdr * sqlite3PcacheDirtyList(PCache *pCache)

{
  PgHdr **ppPVar1;
  uint uVar2;
  PgHdr *pPVar3;
  PgHdr *pPVar4;
  PgHdr *pPVar5;
  PgHdr *pPVar6;
  long lVar7;
  PgHdr *pPVar8;
  PgHdr *pPVar9;
  PgHdr result;
  PgHdr local_160;
  PgHdr *local_118 [33];
  
  pPVar5 = pCache->pDirty;
  pPVar3 = pPVar5;
  if (pPVar5 == (PgHdr *)0x0) {
    memset(local_118,0,0x100);
    pPVar3 = (PgHdr *)0x0;
  }
  else {
    do {
      pPVar8 = pPVar3->pDirtyNext;
      pPVar3->pDirty = pPVar8;
      pPVar3 = pPVar8;
    } while (pPVar8 != (PgHdr *)0x0);
    memset(local_118,0,0x100);
    pPVar3 = (PgHdr *)0x0;
    if (pPVar5 != (PgHdr *)0x0) {
      do {
        pPVar8 = pPVar5->pDirty;
        pPVar5->pDirty = (PgHdr *)0x0;
        lVar7 = 0;
        do {
          pPVar3 = &local_160;
          pPVar9 = local_118[lVar7];
          if (local_118[lVar7] == (PgHdr *)0x0) {
            local_118[lVar7] = pPVar5;
            goto LAB_0014ddb2;
          }
          do {
            pPVar6 = pPVar9;
            uVar2 = pPVar6->pgno;
            while (pPVar5->pgno <= uVar2) {
              pPVar3->pDirty = pPVar5;
              ppPVar1 = &pPVar5->pDirty;
              pPVar4 = pPVar6;
              pPVar3 = pPVar5;
              pPVar5 = *ppPVar1;
              if (*ppPVar1 == (PgHdr *)0x0) goto LAB_0014dd35;
            }
            pPVar3->pDirty = pPVar6;
            pPVar4 = pPVar5;
            pPVar3 = pPVar6;
            pPVar9 = pPVar6->pDirty;
          } while (pPVar6->pDirty != (PgHdr *)0x0);
LAB_0014dd35:
          pPVar3->pDirty = pPVar4;
          local_118[lVar7] = (PgHdr *)0x0;
          lVar7 = lVar7 + 1;
          pPVar5 = local_160.pDirty;
          pPVar3 = &local_160;
          pPVar9 = local_118[0x1f];
        } while (lVar7 != 0x1f);
        do {
          uVar2 = pPVar9->pgno;
          while (pPVar5->pgno <= uVar2) {
            pPVar3->pDirty = pPVar5;
            ppPVar1 = &pPVar5->pDirty;
            pPVar6 = pPVar9;
            pPVar3 = pPVar5;
            pPVar5 = *ppPVar1;
            if (*ppPVar1 == (PgHdr *)0x0) goto LAB_0014dda1;
          }
          pPVar3->pDirty = pPVar9;
          ppPVar1 = &pPVar9->pDirty;
          pPVar6 = pPVar5;
          pPVar3 = pPVar9;
          pPVar9 = *ppPVar1;
        } while (*ppPVar1 != (PgHdr *)0x0);
LAB_0014dda1:
        pPVar3->pDirty = pPVar6;
        local_118[0x1f] = local_160.pDirty;
LAB_0014ddb2:
        pPVar3 = local_118[0];
        pPVar5 = pPVar8;
      } while (pPVar8 != (PgHdr *)0x0);
    }
  }
  lVar7 = 1;
  do {
    pPVar5 = local_118[lVar7];
    pPVar8 = pPVar3;
    if ((pPVar5 != (PgHdr *)0x0) && (pPVar8 = pPVar5, pPVar9 = &local_160, pPVar3 != (PgHdr *)0x0))
    {
      do {
        pPVar8 = pPVar3;
        uVar2 = pPVar8->pgno;
        while (pPVar5->pgno <= uVar2) {
          pPVar9->pDirty = pPVar5;
          ppPVar1 = &pPVar5->pDirty;
          pPVar6 = pPVar8;
          pPVar9 = pPVar5;
          pPVar5 = *ppPVar1;
          if (*ppPVar1 == (PgHdr *)0x0) goto LAB_0014de31;
        }
        pPVar9->pDirty = pPVar8;
        pPVar6 = pPVar5;
        pPVar3 = pPVar8->pDirty;
        pPVar9 = pPVar8;
      } while (pPVar8->pDirty != (PgHdr *)0x0);
LAB_0014de31:
      pPVar9->pDirty = pPVar6;
      pPVar8 = local_160.pDirty;
    }
    lVar7 = lVar7 + 1;
    pPVar3 = pPVar8;
    if (lVar7 == 0x20) {
      return pPVar8;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE PgHdr *sqlite3PcacheDirtyList(PCache *pCache){
  PgHdr *p;
  for(p=pCache->pDirty; p; p=p->pDirtyNext){
    p->pDirty = p->pDirtyNext;
  }
  return pcacheSortDirtyList(pCache->pDirty);
}